

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamlParser.h
# Opt level: O3

void __thiscall yaml::Value::Value(Value *this,string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  pointer pcVar4;
  undefined8 uVar5;
  
  this->type_ = String;
  paVar1 = &(this->string_).field_2;
  (this->string_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (s->_M_dataplus)._M_p;
  paVar2 = &s->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined8 *)((long)&s->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->string_).field_2 + 8) = uVar5;
  }
  else {
    (this->string_)._M_dataplus._M_p = pcVar4;
    (this->string_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->string_)._M_string_length = s->_M_string_length;
  (s->_M_dataplus)._M_p = (pointer)paVar2;
  s->_M_string_length = 0;
  (s->field_2)._M_local_buf[0] = '\0';
  p_Var3 = &(this->mapping_).map_._M_t._M_impl.super__Rb_tree_header;
  (this->mapping_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mapping_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mapping_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->mapping_).map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->mapping_).map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->sequence_).super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->sequence_).super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->sequence_).super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Value(std::string &&s) : type_(Type::String), string_(std::move(s)) {}